

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O0

bool cmMessageCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  string_view initial;
  LogLevel t;
  const_iterator cVar1;
  cmExecutionStatus *this;
  bool bVar2;
  reference pbVar3;
  cmMessenger *this_00;
  cmake *this_01;
  string_view what;
  string_view what_00;
  bool local_3fa;
  byte local_39a;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8 [32];
  string_view local_2d8;
  string_view local_2c8;
  string local_2b8 [32];
  string_view local_298;
  string_view local_288;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  undefined1 local_1d8 [24];
  _Elt_pointer local_1c0;
  string_view local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_198;
  undefined1 local_188 [8];
  string message;
  LogLevel desiredLevel;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  byte local_c3;
  byte local_c2;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  int local_78;
  int local_74;
  CheckingType checkingType;
  LogLevel level;
  bool fatal;
  const_iterator cStack_68;
  MessageType type;
  const_iterator i;
  cmMakefile *mf;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  this = local_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cmExecutionStatus::GetMakefile(local_20);
    cStack_68 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::cbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
    level = LOG_STATUS;
    checkingType._3_1_ = UNDEFINED >> 0x18;
    local_74 = 0;
    local_78 = 0;
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&stack0xffffffffffffff98);
    bVar2 = std::operator==(pbVar3,"SEND_ERROR");
    if (bVar2) {
      level = LOG_WARNING;
      local_74 = 1;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&stack0xffffffffffffff98);
    }
    else {
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&stack0xffffffffffffff98);
      bVar2 = std::operator==(pbVar3,"FATAL_ERROR");
      if (bVar2) {
        checkingType._3_1_ = 1;
        level = LOG_WARNING;
        local_74 = 1;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&stack0xffffffffffffff98);
      }
      else {
        pbVar3 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&stack0xffffffffffffff98);
        bVar2 = std::operator==(pbVar3,"WARNING");
        if (bVar2) {
          level = LOG_VERBOSE;
          local_74 = 2;
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&stack0xffffffffffffff98);
        }
        else {
          pbVar3 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&stack0xffffffffffffff98);
          bVar2 = std::operator==(pbVar3,"AUTHOR_WARNING");
          cVar1 = i;
          if (bVar2) {
            std::allocator<char>::allocator();
            local_c2 = 0;
            local_c3 = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_98,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_99);
            bVar2 = cmMakefile::IsSet((cmMakefile *)cVar1._M_current,&local_98);
            cVar1 = i;
            local_39a = 0;
            if (bVar2) {
              std::allocator<char>::allocator();
              local_c2 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_c0,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_c1);
              local_c3 = 1;
              bVar2 = cmMakefile::IsOn((cmMakefile *)cVar1._M_current,&local_c0);
              local_39a = bVar2 ^ 0xff;
            }
            if ((local_c3 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_c0);
            }
            if ((local_c2 & 1) != 0) {
              std::allocator<char>::~allocator(&local_c1);
            }
            std::__cxx11::string::~string((string *)&local_98);
            std::allocator<char>::~allocator(&local_99);
            cVar1 = i;
            if ((local_39a & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e8,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_e9);
              bVar2 = cmMakefile::IsOn((cmMakefile *)cVar1._M_current,&local_e8);
              std::__cxx11::string::~string((string *)&local_e8);
              std::allocator<char>::~allocator(&local_e9);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                args_local._7_1_ = 1;
                goto LAB_00336e65;
              }
              level = LOG_UNDEFINED;
              local_74 = 2;
            }
            else {
              checkingType._3_1_ = 1;
              level = LOG_ERROR;
              local_74 = 1;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&stack0xffffffffffffff98);
          }
          else {
            pbVar3 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&stack0xffffffffffffff98);
            bVar2 = std::operator==(pbVar3,"CHECK_START");
            if (bVar2) {
              local_74 = 4;
              local_78 = 1;
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&stack0xffffffffffffff98);
            }
            else {
              pbVar3 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&stack0xffffffffffffff98);
              bVar2 = std::operator==(pbVar3,"CHECK_PASS");
              if (bVar2) {
                local_74 = 4;
                local_78 = 2;
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&stack0xffffffffffffff98);
              }
              else {
                pbVar3 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&stack0xffffffffffffff98);
                bVar2 = std::operator==(pbVar3,"CHECK_FAIL");
                if (bVar2) {
                  local_74 = 4;
                  local_78 = 3;
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&stack0xffffffffffffff98);
                }
                else {
                  pbVar3 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&stack0xffffffffffffff98);
                  bVar2 = std::operator==(pbVar3,"STATUS");
                  if (bVar2) {
                    local_74 = 4;
                    __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++(&stack0xffffffffffffff98);
                  }
                  else {
                    pbVar3 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*(&stack0xffffffffffffff98);
                    bVar2 = std::operator==(pbVar3,"VERBOSE");
                    if (bVar2) {
                      local_74 = 5;
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++(&stack0xffffffffffffff98);
                    }
                    else {
                      pbVar3 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*(&stack0xffffffffffffff98);
                      bVar2 = std::operator==(pbVar3,"DEBUG");
                      if (bVar2) {
                        local_74 = 6;
                        __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator++(&stack0xffffffffffffff98);
                      }
                      else {
                        pbVar3 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*(&stack0xffffffffffffff98);
                        bVar2 = std::operator==(pbVar3,"TRACE");
                        if (bVar2) {
                          local_74 = 7;
                          __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator++(&stack0xffffffffffffff98);
                        }
                        else {
                          pbVar3 = __gnu_cxx::
                                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator*(&stack0xffffffffffffff98);
                          bVar2 = std::operator==(pbVar3,"DEPRECATION");
                          cVar1 = i;
                          if (bVar2) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_110,"CMAKE_ERROR_DEPRECATED",&local_111);
                            bVar2 = cmMakefile::IsOn((cmMakefile *)cVar1._M_current,&local_110);
                            std::__cxx11::string::~string((string *)&local_110);
                            std::allocator<char>::~allocator(&local_111);
                            cVar1 = i;
                            if (bVar2) {
                              checkingType._3_1_ = 1;
                              level = LOG_TRACE;
                              local_74 = 1;
                            }
                            else {
                              std::allocator<char>::allocator();
                              message.field_2._M_local_buf[0xe] = '\0';
                              message.field_2._M_local_buf[0xd] = '\0';
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_138,"CMAKE_WARN_DEPRECATED",&local_139);
                              bVar2 = cmMakefile::IsSet((cmMakefile *)cVar1._M_current,&local_138);
                              cVar1 = i;
                              local_3fa = true;
                              if (bVar2) {
                                std::allocator<char>::allocator();
                                message.field_2._M_local_buf[0xe] = '\x01';
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&desiredLevel,"CMAKE_WARN_DEPRECATED",
                                           (allocator<char> *)(message.field_2._M_local_buf + 0xf));
                                message.field_2._M_local_buf[0xd] = '\x01';
                                local_3fa = cmMakefile::IsOn((cmMakefile *)cVar1._M_current,
                                                             (string *)&desiredLevel);
                              }
                              if ((message.field_2._M_local_buf[0xd] & 1U) != 0) {
                                std::__cxx11::string::~string((string *)&desiredLevel);
                              }
                              if ((message.field_2._M_local_buf[0xe] & 1U) != 0) {
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)(message.field_2._M_local_buf + 0xf));
                              }
                              std::__cxx11::string::~string((string *)&local_138);
                              std::allocator<char>::~allocator(&local_139);
                              if (local_3fa == false) {
                                args_local._7_1_ = 1;
                                goto LAB_00336e65;
                              }
                              level = 8;
                              local_74 = 2;
                            }
                            __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator++(&stack0xffffffffffffff98);
                          }
                          else {
                            pbVar3 = __gnu_cxx::
                                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::operator*(&stack0xffffffffffffff98);
                            bVar2 = std::operator==(pbVar3,"NOTICE");
                            if (bVar2) {
                              local_74 = 3;
                              __gnu_cxx::
                              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator++(&stack0xffffffffffffff98);
                            }
                            else {
                              local_74 = 3;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (local_74 == 0) {
      __assert_fail("\"Message log level expected to be set\" && level != Message::LogLevel::LOG_UNDEFINED"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMessageCommand.cxx"
                    ,0x9e,
                    "bool cmMessageCommand(const std::vector<std::string> &, cmExecutionStatus &)");
    }
    message.field_2._8_4_ = cmMakefile::GetCurrentLogLevel((cmMakefile *)i._M_current);
    if ((int)message.field_2._8_4_ < local_74) {
      args_local._7_1_ = 1;
    }
    else {
      local_1a0._M_current = cStack_68._M_current;
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::cend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
      local_198 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            (local_1a0,
                             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_1a8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b8,"");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)(local_1d8 + 0x10));
      initial._M_str = (char *)local_1c0;
      initial._M_len = local_1d8._16_8_;
      cmJoin((string *)local_188,&local_198,local_1b8,initial);
      cVar1 = i;
      switch(local_74) {
      case 1:
      case 2:
        this_00 = cmMakefile::GetMessenger((cmMakefile *)i._M_current);
        t = level;
        cmMakefile::GetBacktrace((cmMakefile *)local_1d8);
        cmMessenger::DisplayMessage(this_00,t,(string *)local_188,(cmListFileBacktrace *)local_1d8);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1d8);
        break;
      case 3:
        std::__cxx11::string::string((string *)&local_218,(string *)local_188);
        anon_unknown.dwarf_4cd6b3::IndentText(&local_1f8,&local_218,(cmMakefile *)i._M_current);
        cmSystemTools::Message(&local_1f8,(char *)0x0);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        break;
      case 4:
        if (local_78 == 1) {
          std::__cxx11::string::string((string *)&local_258,(string *)local_188);
          anon_unknown.dwarf_4cd6b3::IndentText(&local_238,&local_258,(cmMakefile *)i._M_current);
          cmMakefile::DisplayStatus((cmMakefile *)cVar1._M_current,&local_238,-1.0);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)&local_258);
          this_01 = cmMakefile::GetCMakeInstance((cmMakefile *)i._M_current);
          std::__cxx11::string::string((string *)&local_278,(string *)local_188);
          cmake::PushCheckInProgressMessage(this_01,&local_278);
          std::__cxx11::string::~string((string *)&local_278);
        }
        else if (local_78 == 2) {
          local_298 = (string_view)cm::operator____s("CHECK_PASS",10);
          local_288 = local_298;
          std::__cxx11::string::string(local_2b8,(string *)local_188);
          what._M_str = (char *)local_2b8;
          what._M_len = (size_t)local_288._M_str;
          anon_unknown.dwarf_4cd6b3::ReportCheckResult
                    ((anon_unknown_dwarf_4cd6b3 *)local_288._M_len,what,i._M_current,
                     (cmMakefile *)local_1d8._16_8_);
          std::__cxx11::string::~string(local_2b8);
        }
        else if (local_78 == 3) {
          local_2d8 = (string_view)cm::operator____s("CHECK_FAIL",10);
          local_2c8 = local_2d8;
          std::__cxx11::string::string(local_2f8,(string *)local_188);
          what_00._M_str = (char *)local_2f8;
          what_00._M_len = (size_t)local_2c8._M_str;
          anon_unknown.dwarf_4cd6b3::ReportCheckResult
                    ((anon_unknown_dwarf_4cd6b3 *)local_2c8._M_len,what_00,i._M_current,
                     (cmMakefile *)local_1d8._16_8_);
          std::__cxx11::string::~string(local_2f8);
        }
        else {
          std::__cxx11::string::string((string *)&local_338,(string *)local_188);
          anon_unknown.dwarf_4cd6b3::IndentText(&local_318,&local_338,(cmMakefile *)i._M_current);
          cmMakefile::DisplayStatus((cmMakefile *)cVar1._M_current,&local_318,-1.0);
          std::__cxx11::string::~string((string *)&local_318);
          std::__cxx11::string::~string((string *)&local_338);
        }
        break;
      case 5:
      case 6:
      case 7:
        std::__cxx11::string::string((string *)&local_378,(string *)local_188);
        anon_unknown.dwarf_4cd6b3::IndentText(&local_358,&local_378,(cmMakefile *)i._M_current);
        cmMakefile::DisplayStatus((cmMakefile *)cVar1._M_current,&local_358,-1.0);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_378);
        break;
      default:
        __assert_fail("\"Unexpected log level! Review the `cmMessageCommand.cxx`.\" && false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMessageCommand.cxx"
                      ,0xd1,
                      "bool cmMessageCommand(const std::vector<std::string> &, cmExecutionStatus &)"
                     );
      }
      if ((checkingType._3_1_ & 1) != UNDEFINED >> 0x18) {
        cmSystemTools::SetFatalErrorOccurred();
      }
      args_local._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_188);
    }
  }
LAB_00336e65:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmMessageCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  auto& mf = status.GetMakefile();

  auto i = args.cbegin();

  auto type = MessageType::MESSAGE;
  auto fatal = false;
  auto level = Message::LogLevel::LOG_UNDEFINED;
  auto checkingType = CheckingType::UNDEFINED;
  if (*i == "SEND_ERROR") {
    type = MessageType::FATAL_ERROR;
    level = Message::LogLevel::LOG_ERROR;
    ++i;
  } else if (*i == "FATAL_ERROR") {
    fatal = true;
    type = MessageType::FATAL_ERROR;
    level = Message::LogLevel::LOG_ERROR;
    ++i;
  } else if (*i == "WARNING") {
    type = MessageType::WARNING;
    level = Message::LogLevel::LOG_WARNING;
    ++i;
  } else if (*i == "AUTHOR_WARNING") {
    if (mf.IsSet("CMAKE_SUPPRESS_DEVELOPER_ERRORS") &&
        !mf.IsOn("CMAKE_SUPPRESS_DEVELOPER_ERRORS")) {
      fatal = true;
      type = MessageType::AUTHOR_ERROR;
      level = Message::LogLevel::LOG_ERROR;
    } else if (!mf.IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
      type = MessageType::AUTHOR_WARNING;
      level = Message::LogLevel::LOG_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "CHECK_START") {
    level = Message::LogLevel::LOG_STATUS;
    checkingType = CheckingType::CHECK_START;
    ++i;
  } else if (*i == "CHECK_PASS") {
    level = Message::LogLevel::LOG_STATUS;
    checkingType = CheckingType::CHECK_PASS;
    ++i;
  } else if (*i == "CHECK_FAIL") {
    level = Message::LogLevel::LOG_STATUS;
    checkingType = CheckingType::CHECK_FAIL;
    ++i;
  } else if (*i == "STATUS") {
    level = Message::LogLevel::LOG_STATUS;
    ++i;
  } else if (*i == "VERBOSE") {
    level = Message::LogLevel::LOG_VERBOSE;
    ++i;
  } else if (*i == "DEBUG") {
    level = Message::LogLevel::LOG_DEBUG;
    ++i;
  } else if (*i == "TRACE") {
    level = Message::LogLevel::LOG_TRACE;
    ++i;
  } else if (*i == "DEPRECATION") {
    if (mf.IsOn("CMAKE_ERROR_DEPRECATED")) {
      fatal = true;
      type = MessageType::DEPRECATION_ERROR;
      level = Message::LogLevel::LOG_ERROR;
    } else if (!mf.IsSet("CMAKE_WARN_DEPRECATED") ||
               mf.IsOn("CMAKE_WARN_DEPRECATED")) {
      type = MessageType::DEPRECATION_WARNING;
      level = Message::LogLevel::LOG_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "NOTICE") {
    // `NOTICE` message type is going to be output to stderr
    level = Message::LogLevel::LOG_NOTICE;
    ++i;
  } else {
    // Messages w/o any type are `NOTICE`s
    level = Message::LogLevel::LOG_NOTICE;
  }
  assert("Message log level expected to be set" &&
         level != Message::LogLevel::LOG_UNDEFINED);

  Message::LogLevel desiredLevel = mf.GetCurrentLogLevel();

  if (desiredLevel < level) {
    // Suppress the message
    return true;
  }

  auto message = cmJoin(cmMakeRange(i, args.cend()), "");

  switch (level) {
    case Message::LogLevel::LOG_ERROR:
    case Message::LogLevel::LOG_WARNING:
      // we've overridden the message type, above, so display it directly
      mf.GetMessenger()->DisplayMessage(type, message, mf.GetBacktrace());
      break;

    case Message::LogLevel::LOG_NOTICE:
      cmSystemTools::Message(IndentText(message, mf));
      break;

    case Message::LogLevel::LOG_STATUS:
      switch (checkingType) {
        case CheckingType::CHECK_START:
          mf.DisplayStatus(IndentText(message, mf), -1);
          mf.GetCMakeInstance()->PushCheckInProgressMessage(message);
          break;

        case CheckingType::CHECK_PASS:
          ReportCheckResult("CHECK_PASS"_s, message, mf);
          break;

        case CheckingType::CHECK_FAIL:
          ReportCheckResult("CHECK_FAIL"_s, message, mf);
          break;

        default:
          mf.DisplayStatus(IndentText(message, mf), -1);
          break;
      }
      break;

    case Message::LogLevel::LOG_VERBOSE:
    case Message::LogLevel::LOG_DEBUG:
    case Message::LogLevel::LOG_TRACE:
      mf.DisplayStatus(IndentText(message, mf), -1);
      break;

    default:
      assert("Unexpected log level! Review the `cmMessageCommand.cxx`." &&
             false);
      break;
  }

  if (fatal) {
    cmSystemTools::SetFatalErrorOccurred();
  }
  return true;
}